

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
ModRequestGameCommand::trigger
          (ModRequestGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  size_t __n;
  undefined8 *puVar10;
  undefined8 uVar11;
  size_t sVar12;
  int iVar13;
  long lVar14;
  undefined8 *puVar15;
  size_type __rlen;
  undefined1 auVar16 [16];
  ulong local_f8;
  string user_message;
  string local_90;
  string channel_message;
  string fmtName;
  
  sVar2 = pluginInstance.m_staffTitle._M_string_length;
  _Var1._M_p = pluginInstance.m_staffTitle._M_dataplus._M_p;
  sVar12 = parameters._M_len;
  if (sVar12 == 0) {
    RenX::Server::sendMessage
              (source,player,0x3c,"Please specify a reason for requesting moderator assistance.");
    return;
  }
  RenX::getFormattedPlayerName_abi_cxx11_((PlayerInfo *)&fmtName);
  string_printf_abi_cxx11_
            (&user_message,
             "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game for \"%.*s\"; please look in "
             ,sVar2,_Var1._M_p,fmtName._M_string_length,fmtName._M_dataplus._M_p,sVar12,
             parameters._M_str);
  string_printf_abi_cxx11_
            (&channel_message,
             "\x0312[%.*s Request] \x03\x02%.*s\x02\x0307 has requested assistance in-game! Reason: %.*s\x03"
             ,sVar2,_Var1._M_p,fmtName._M_string_length,fmtName._M_dataplus._M_p,sVar12,
             parameters._M_str);
  lVar6 = ServerManager::size();
  if (lVar6 == 0) {
    local_f8 = 0;
  }
  else {
    local_f8 = 0;
    lVar14 = 0;
    do {
      lVar7 = ServerManager::getServer(_serverManager);
      if (lVar7 != 0) {
        lVar8 = Jupiter::IRC::Client::getChannels_abi_cxx11_();
        for (puVar9 = *(undefined8 **)(lVar8 + 0x10); puVar9 != (undefined8 *)0x0;
            puVar9 = (undefined8 *)*puVar9) {
          Jupiter::IRC::Client::Channel::getType();
          cVar4 = RenX::Server::isAdminLogChanType((int)source);
          if (cVar4 != '\0') {
            auVar16 = Jupiter::IRC::Client::Channel::getName();
            Jupiter::IRC::Client::sendMessage
                      (lVar7,auVar16._0_8_,auVar16._8_8_,channel_message._M_string_length,
                       channel_message._M_dataplus._M_p);
            sVar3 = user_message._M_string_length;
            auVar16 = Jupiter::IRC::Client::Channel::getName();
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&user_message,auVar16._8_8_,auVar16._0_8_);
            lVar8 = Jupiter::IRC::Client::Channel::getUsers_abi_cxx11_();
            iVar13 = 0;
            for (puVar15 = *(undefined8 **)(lVar8 + 0x10); puVar15 != (undefined8 *)0x0;
                puVar15 = (undefined8 *)*puVar15) {
              cVar4 = Jupiter::IRC::Client::Channel::getUserPrefix((User *)(puVar9 + 5));
              if (cVar4 != '\0') {
                auVar16 = Jupiter::IRC::Client::getNickname();
                __n = auVar16._0_8_;
                puVar10 = (undefined8 *)
                          Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                if ((__n != puVar10[1]) ||
                   ((__n != 0 && (iVar5 = bcmp(auVar16._8_8_,(void *)*puVar10,__n), iVar5 != 0)))) {
                  puVar10 = (undefined8 *)
                            Jupiter::IRC::Client::Channel::User::getNickname_abi_cxx11_();
                  Jupiter::IRC::Client::sendMessage
                            (lVar7,puVar10[1],*puVar10,user_message._M_string_length,
                             user_message._M_dataplus._M_p);
                  iVar13 = iVar13 + 1;
                }
              }
            }
            if (user_message._M_string_length < sVar3) {
              uVar11 = std::__throw_out_of_range_fmt
                                 ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                  "basic_string::erase");
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)channel_message._M_dataplus._M_p != &channel_message.field_2) {
                operator_delete(channel_message._M_dataplus._M_p,
                                channel_message.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)user_message._M_dataplus._M_p != &user_message.field_2) {
                operator_delete(user_message._M_dataplus._M_p,
                                user_message.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
                operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
              }
              _Unwind_Resume(uVar11);
            }
            user_message._M_dataplus._M_p[sVar3] = '\0';
            local_f8 = (ulong)(uint)((int)local_f8 + iVar13);
            user_message._M_string_length = sVar3;
          }
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar6);
  }
  string_printf_abi_cxx11_
            (&local_90,"A total of %u %.*ss have been notified of your assistance request.",local_f8
             ,sVar2,_Var1._M_p);
  RenX::Server::sendMessage(source,player,local_90._M_string_length,local_90._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)channel_message._M_dataplus._M_p != &channel_message.field_2) {
    operator_delete(channel_message._M_dataplus._M_p,
                    channel_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)user_message._M_dataplus._M_p != &user_message.field_2) {
    operator_delete(user_message._M_dataplus._M_p,user_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fmtName._M_dataplus._M_p != &fmtName.field_2) {
    operator_delete(fmtName._M_dataplus._M_p,fmtName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ModRequestGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (parameters.empty()) {
		source->sendMessage(*player, "Please specify a reason for requesting moderator assistance."sv);
		return;
	}

	std::string_view staff_word = pluginInstance.getStaffTitle();
	std::string fmtName = RenX::getFormattedPlayerName(*player);
	std::string user_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game for \"%.*s\"; please look in ", staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());
	std::string channel_message = string_printf(IRCCOLOR "12[%.*s Request] " IRCCOLOR IRCBOLD "%.*s" IRCBOLD IRCCOLOR "07 has requested assistance in-game! Reason: %.*s" IRCCOLOR, staff_word.size(),
		staff_word.data(), fmtName.size(), fmtName.data(), parameters.size(),
		parameters.data());

	// Alerts a channel and all relevant users in the channel
	auto alert_channel = [&user_message, &channel_message](Jupiter::IRC::Client& server, const Jupiter::IRC::Client::Channel& channel) {
		// Alert channel
		server.sendMessage(channel.getName(), channel_message);

		// Alert relevant users in the channel
		unsigned int total_user_alerts{};
		size_t base_length = user_message.size();
		user_message += channel.getName();

		for (auto& user : channel.getUsers()) {
			if (channel.getUserPrefix(*user.second) != 0 // If the user has a prefix...
				&& user.second->getNickname() != server.getNickname()) { // And the user isn't this bot...
				// Alert the user
				server.sendMessage(user.second->getNickname(), user_message);
				++total_user_alerts;
			}
		}

		user_message.erase(base_length);
		return total_user_alerts;
	};

	// TODO: clean this up by just exposing a vector of servers...
	// Send off alerts
	unsigned int total_user_alerts{};
	size_t server_count = serverManager->size();
	for (size_t server_index = 0; server_index < server_count; ++server_index) {
		if (Jupiter::IRC::Client *server = serverManager->getServer(server_index)) {
			// Alert all admin channels (and their relevant users)
			for (auto& channel : server->getChannels()) {
				if (source->isAdminLogChanType(channel.second.getType())) {
					total_user_alerts += alert_channel(*server, channel.second);
				}
			}
		}
	}

	// Inform the user of the result
	source->sendMessage(*player, string_printf("A total of %u %.*ss have been notified of your assistance request.", total_user_alerts, staff_word.size(),
		staff_word.data()));
}